

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndsWithMatch.cpp
# Opt level: O3

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::EndsWithMatch::match(EndsWithMatch *this,shared_ptr<const_oout::Text> *in)

{
  int iVar1;
  ostream *poVar2;
  TestResult *this_00;
  undefined8 *in_RDX;
  string origin;
  ostringstream message;
  bool local_21a;
  allocator local_219;
  CondResult *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_210;
  shared_ptr<const_oout::Result> local_208;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  element_type *local_1c8;
  long local_1c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  (**(code **)(*(long *)*in_RDX + 0x10))(&local_1f0);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\'",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)local_1f0,local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' ends with \'",0xd);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)(in->
                                     super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount._M_pi,
                      (long)in[1].super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
  std::__cxx11::string::string
            ((string *)&local_1d0,(string *)&local_1f0,
             local_1e8 -
             (long)in[1].super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_219);
  if (local_1c8 == in[1].super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    if (local_1c8 == (element_type *)0x0) {
      local_21a = true;
    }
    else {
      iVar1 = bcmp(local_1d0,
                   (in->super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi,(size_t)local_1c8);
      local_21a = iVar1 == 0;
    }
  }
  else {
    local_21a = false;
  }
  std::__cxx11::stringbuf::str();
  local_218 = (CondResult *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::CondResult,std::allocator<oout::CondResult>,bool,std::__cxx11::string>
            (&_Stack_210,&local_218,(allocator<oout::CondResult> *)&local_208,&local_21a,&local_1b0)
  ;
  this_00 = (TestResult *)operator_new(0x18);
  local_208.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_218->super_Result;
  local_208.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_210._M_pi;
  local_218 = (CondResult *)0x0;
  _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  TestResult::TestResult(this_00,&local_208);
  if (local_208.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Match)._vptr_Match = (_func_int **)this_00;
  if (_Stack_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_210._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> EndsWithMatch::match(const shared_ptr<const Text> &in) const
{
	const auto origin = in->asString();
	ostringstream message;
	message << "'" << origin << "' ends with '" << text << "'";

	return make_unique<TestResult>(
		make_shared<CondResult>(
			string(origin, origin.size() - text.size()) == text,
			message.str()
		)
	);
}